

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O0

void rogue_vision(char **next,char *rmin,char *rmax)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int zy;
  int zx;
  int ylo;
  int yhi;
  int xlo;
  int xhi;
  int in_door;
  int stop;
  int start;
  int rnum;
  char *rmax_local;
  char *rmin_local;
  char **next_local;
  
  iVar2 = (*(uint *)&level->locations[u.ux][u.uy].field_0x6 >> 0x10 & 0x3f) - 3;
  if (-1 < iVar2) {
    for (local_48 = level->rooms[iVar2].ly + -1; local_48 <= level->rooms[iVar2].hy + 1;
        local_48 = local_48 + 1) {
      local_44 = level->rooms[iVar2].lx + -1;
      rmin[local_48] = (char)local_44;
      iVar3 = level->rooms[iVar2].hx + 1;
      rmax[local_48] = (char)iVar3;
      for (; local_44 <= iVar3; local_44 = local_44 + 1) {
        if (level->rooms[iVar2].rlit == '\0') {
          next[local_48][local_44] = '\x01';
        }
        else {
          next[local_48][local_44] = '\x03';
          level->locations[local_44][local_48].seenv = 0xff;
        }
      }
    }
  }
  cVar1 = level->locations[u.ux][u.uy].typ;
  if (u.uy + -1 < 1) {
    local_4c = 0;
  }
  else {
    local_4c = u.uy + -1;
  }
  if (u.uy + 1 < 0x14) {
    local_50 = u.uy + 1;
  }
  else {
    local_50 = 0x14;
  }
  if (u.ux + -1 < 2) {
    local_54 = 1;
  }
  else {
    local_54 = u.ux + -1;
  }
  if (u.ux + 1 < 0x4f) {
    local_58 = u.ux + 1;
  }
  else {
    local_58 = 0x4f;
  }
  for (local_48 = local_4c; local_48 <= local_50; local_48 = local_48 + 1) {
    if (local_54 < rmin[local_48]) {
      rmin[local_48] = (char)local_54;
    }
    if (rmax[local_48] < local_58) {
      rmax[local_48] = (char)local_58;
    }
    for (local_44 = local_54; local_44 <= local_58; local_44 = local_44 + 1) {
      next[local_48][local_44] = '\x03';
      if ((cVar1 == '\x17') && ((local_44 == u.ux || (local_48 == u.uy)))) {
        newsym(local_44,local_48);
      }
    }
  }
  return;
}

Assistant:

static void rogue_vision(char **next, /* could_see array pointers */
			 char *rmin, char *rmax)
{
    int rnum = level->locations[u.ux][u.uy].roomno - ROOMOFFSET; /* no SHARED... */
    int start, stop, in_door, xhi, xlo, yhi, ylo;
    int zx, zy;

    /* If in a lit room, we are able to see to its boundaries. */
    /* If dark, set COULD_SEE so various spells work -dlc */
    if (rnum >= 0) {
	for (zy = level->rooms[rnum].ly-1; zy <= level->rooms[rnum].hy+1; zy++) {
	    rmin[zy] = start = level->rooms[rnum].lx-1;
	    rmax[zy] = stop  = level->rooms[rnum].hx+1;

	    for (zx = start; zx <= stop; zx++) {
		if (level->rooms[rnum].rlit) {
		    next[zy][zx] = COULD_SEE | IN_SIGHT;
		    level->locations[zx][zy].seenv = SVALL;	/* see the walls */
		} else
		    next[zy][zx] = COULD_SEE;
	    }
	}
    }

    in_door = level->locations[u.ux][u.uy].typ == DOOR;

    /* Can always see adjacent. */
    ylo = max(u.uy - 1, 0);
    yhi = min(u.uy + 1, ROWNO - 1);
    xlo = max(u.ux - 1, 1);
    xhi = min(u.ux + 1, COLNO - 1);
    for (zy = ylo; zy <= yhi; zy++) {
	if (xlo < rmin[zy]) rmin[zy] = xlo;
	if (xhi > rmax[zy]) rmax[zy] = xhi;

	for (zx = xlo; zx <= xhi; zx++) {
	    next[zy][zx] = COULD_SEE | IN_SIGHT;
	    /*
	     * Yuck, update adjacent non-diagonal positions when in a doorway.
	     * We need to do this to catch the case when we first step into
	     * a room.  The room's walls were not seen from the outside, but
	     * now are seen (the seen bits are set just above).  However, the
	     * positions are not updated because they were already in sight.
	     * So, we have to do it here.
	     */
	    if (in_door && (zx == u.ux || zy == u.uy)) newsym(zx,zy);
	}
    }
}